

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool Curl_is_ASCII_name(char *hostname)

{
  char cVar1;
  
  if (hostname != (char *)0x0) {
    do {
      cVar1 = *hostname;
      hostname = hostname + 1;
    } while ('\0' < cVar1);
    return cVar1 == '\0';
  }
  return true;
}

Assistant:

bool Curl_is_ASCII_name(const char *hostname)
{
  /* get an UNSIGNED local version of the pointer */
  const unsigned char *ch = (const unsigned char *)hostname;

  if(!hostname) /* bad input, consider it ASCII! */
    return TRUE;

  while(*ch) {
    if(*ch++ & 0x80)
      return FALSE;
  }
  return TRUE;
}